

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

CaseInvariantPropertyListWithHashCode ** __thiscall
JsUtil::
BaseHashSet<Js::CaseInvariantPropertyListWithHashCode*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::CaseInvariantPropertyListWithHashCode*,JsUtil::NoCaseComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::LookupWithKey<JsUtil::CharacterBuffer<char16_t>>
          (BaseHashSet<Js::CaseInvariantPropertyListWithHashCode_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::CaseInvariantPropertyListWithHashCode_*,_JsUtil::NoCaseComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *this,CharacterBuffer<char16_t> *key)

{
  CaseInvariantPropertyListWithHashCode **ppCVar1;
  
  ppCVar1 = BaseDictionary<Js::CaseInvariantPropertyListWithHashCode*,Js::CaseInvariantPropertyListWithHashCode*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,JsUtil::NoCaseComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
            ::LookupWithKey<JsUtil::CharacterBuffer<char16_t>>
                      ((BaseDictionary<Js::CaseInvariantPropertyListWithHashCode*,Js::CaseInvariantPropertyListWithHashCode*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,JsUtil::NoCaseComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                        *)this,key,
                       &BaseHashSet<Js::CaseInvariantPropertyListWithHashCode_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::CaseInvariantPropertyListWithHashCode_*,_JsUtil::NoCaseComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                        ::LookupWithKey<JsUtil::CharacterBuffer<char16_t>_>::nullElement);
  return ppCVar1;
}

Assistant:

TElement const& LookupWithKey(KeyType const& key)
        {
            static const TElement nullElement = nullptr;

            return __super::LookupWithKey(key, nullElement);
        }